

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

void __thiscall timing_registry::dump(timing_registry *this)

{
  bool bVar1;
  value_type local_80;
  reference local_78;
  pair<const_unsigned_long,_timing_registry::task_info> *p;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
  *__range2;
  vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> infos;
  lock_guard<std::recursive_mutex> local_30;
  lock_guard<std::recursive_mutex> __l;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> childrenToDelete;
  timing_registry *this_local;
  
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::vector
            ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)&__l);
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_30,&this->m);
  std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::vector
            ((vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> *)
             &__range2);
  __end2 = std::
           unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
           ::begin(&this->tasks);
  p = (pair<const_unsigned_long,_timing_registry::task_info> *)
      std::
      unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
      ::end(&this->tasks);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false>
                         *)&p);
    if (!bVar1) break;
    local_78 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
               ::operator*(&__end2);
    if ((local_78->second).parentUID == 0) {
      local_80 = &local_78->second;
      std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::
      push_back((vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
                 *)&__range2,&local_80);
    }
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>::
    operator++(&__end2);
  }
  print(this,(vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> *)
             &__range2,0,(vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)&__l);
  std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::~vector
            ((vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> *)
             &__range2);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_30);
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::clear
            ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)&__l);
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::~vector
            ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)&__l);
  return;
}

Assistant:

void dump()
    {
        std::vector<oqpi::task_handle> childrenToDelete;
        {
            std::lock_guard<std::recursive_mutex> __l(m);
            std::vector<task_info*> infos;
            for (auto &p : tasks)
            {
                if (p.second.parentUID == oqpi::invalid_task_uid)
                    infos.push_back(&p.second);
            }
            print(infos, 0, childrenToDelete);
        }
        childrenToDelete.clear();
    }